

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

IShaderResourceVariable * __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::GetStaticVariableByIndex
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType,Uint32 Index
          )

{
  PipelineResourceSignatureImplType *this_00;
  IShaderResourceVariable *pIVar1;
  undefined4 uStack_48;
  Uint32 Index_local;
  string _msg;
  Char *local_20;
  
  Index_local = Index;
  CheckPipelineReady(this);
  if (this->m_UsingImplicitSignature == false) {
    FormatString<char[175]>
              (&_msg,(char (*) [175])
                     "IPipelineState::GetStaticVariableByIndex is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::GetStaticVariableByIndex instead."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
  }
  else {
    if ((this->m_ActiveShaderStages & ShaderType) != SHADER_TYPE_UNKNOWN) {
      this_00 = GetResourceSignature(this,0);
      pIVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetStaticVariableByIndex
                         (&this_00->
                           super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                          ShaderType,Index);
      return pIVar1;
    }
    local_20 = GetShaderTypeLiteralName(ShaderType);
    FormatString<char[40],unsigned_int,char[18],char_const*,char[35],char_const*,char[3]>
              (&_msg,(Diligent *)"Unable to get static variable at index ",
               (char (*) [40])&Index_local,(uint *)0x33af50,(char (*) [18])&local_20,
               (char **)" as the stage is inactive in PSO \'",
               (char (*) [35])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                ).m_Desc,(char **)"\'.",(char (*) [3])CONCAT44(Index_local,uStack_48));
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_msg._M_dataplus._M_p != &_msg.field_2) {
    operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
  }
  return (IShaderResourceVariable *)0x0;
}

Assistant:

GetStaticVariableByIndex(SHADER_TYPE ShaderType,
                                                                                 Uint32      Index) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::GetStaticVariableByIndex is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::GetStaticVariableByIndex instead.");
            return nullptr;
        }

        if ((m_ActiveShaderStages & ShaderType) == 0)
        {
            LOG_WARNING_MESSAGE("Unable to get static variable at index ", Index, " in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is inactive in PSO '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        return this->GetResourceSignature(0)->GetStaticVariableByIndex(ShaderType, Index);
    }